

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

char * vrna_md_option_string(vrna_md_t *md)

{
  size_t sVar1;
  vrna_md_t *md_local;
  
  vrna_md_option_string::options[0] = '\0';
  if (md != (vrna_md_t *)0x0) {
    if (md->dangles != 2) {
      sVar1 = strlen(vrna_md_option_string::options);
      sprintf(vrna_md_option_string::options + sVar1,"-d%d ",(ulong)(uint)md->dangles);
    }
    if (md->special_hp == 0) {
      strcat(vrna_md_option_string::options,"-4 ");
    }
    if (md->noLP != 0) {
      strcat(vrna_md_option_string::options,"--noLP ");
    }
    if (md->noGU != 0) {
      strcat(vrna_md_option_string::options,"--noGU ");
    }
    if (md->noGUclosure != 0) {
      strcat(vrna_md_option_string::options,"--noClosingGU ");
    }
    if ((md->temperature != 37.0) || (NAN(md->temperature))) {
      sVar1 = strlen(vrna_md_option_string::options);
      sprintf(vrna_md_option_string::options + sVar1,"-T %f ",md->temperature);
    }
  }
  return vrna_md_option_string::options;
}

Assistant:

PUBLIC char *
vrna_md_option_string(vrna_md_t *md)
{
  static char options[255];

  *options = '\0';

  if (md) {
    if (md->dangles != VRNA_MODEL_DEFAULT_DANGLES)
      sprintf(options + strlen(options), "-d%d ", md->dangles);

    if (!md->special_hp)
      strcat(options, "-4 ");

    if (md->noLP)
      strcat(options, "--noLP ");

    if (md->noGU)
      strcat(options, "--noGU ");

    if (md->noGUclosure)
      strcat(options, "--noClosingGU ");

    if (md->temperature != VRNA_MODEL_DEFAULT_TEMPERATURE)
      sprintf(options + strlen(options), "-T %f ", md->temperature);
  }

  return options;
}